

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall
cmCursesMainForm::cmCursesMainForm
          (cmCursesMainForm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,int initWidth)

{
  pointer pcVar1;
  string *s;
  reference pvVar2;
  cmAlphaNum local_e0;
  string local_b0;
  cmAlphaNum local_90;
  undefined1 local_60 [8];
  string whereCMake;
  unique_ptr<cmake,_std::default_delete<cmake>_> local_38 [3];
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  int initWidth_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCursesMainForm *this_local;
  
  local_1c = initWidth;
  pvStack_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  cmCursesForm::cmCursesForm(&this->super_cmCursesForm);
  (this->super_cmCursesForm)._vptr_cmCursesForm = (_func_int **)&PTR__cmCursesMainForm_00f4a800;
  std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::vector
            (&this->Entries);
  std::unique_ptr<cmCursesLongMessageForm,std::default_delete<cmCursesLongMessageForm>>::
  unique_ptr<std::default_delete<cmCursesLongMessageForm>,void>
            ((unique_ptr<cmCursesLongMessageForm,std::default_delete<cmCursesLongMessageForm>> *)
             &this->LogForm);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs);
  this->HasNonStatusOutputs = false;
  std::__cxx11::string::string((string *)&this->LastProgress);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Args,args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->HelpMessage);
  std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::vector(&this->Fields);
  this->NumberOfVisibleEntries = 0;
  this->AdvancedMode = false;
  this->OkToGenerate = false;
  this->NumberOfPages = 0;
  this->IsEmpty = false;
  std::unique_ptr<cmCursesCacheEntryComposite,std::default_delete<cmCursesCacheEntryComposite>>::
  unique_ptr<std::default_delete<cmCursesCacheEntryComposite>,void>
            ((unique_ptr<cmCursesCacheEntryComposite,std::default_delete<cmCursesCacheEntryComposite>>
              *)&this->EmptyCacheEntry);
  this->InitialWidth = local_1c;
  std::unique_ptr<cmake,std::default_delete<cmake>>::unique_ptr<std::default_delete<cmake>,void>
            ((unique_ptr<cmake,std::default_delete<cmake>> *)&this->CMakeInstance);
  std::__cxx11::string::string((string *)&this->SearchString);
  std::__cxx11::string::string((string *)&this->OldSearchString);
  this->SearchMode = false;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[58]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->HelpMessage
             ,(char (*) [58])"Welcome to ccmake, curses based user interface for CMake.");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&this->HelpMessage);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->HelpMessage
             ,&s_ConstHelpMessage);
  whereCMake.field_2._12_4_ = 2;
  whereCMake.field_2._8_4_ = 1;
  std::make_unique<cmake,cmake::Role,cmState::Mode>
            ((Role *)local_38,(Mode *)(whereCMake.field_2._M_local_buf + 0xc));
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator=(&this->CMakeInstance,local_38);
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr(local_38);
  pcVar1 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
  s = cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
  cmake::SetCMakeEditCommand(pcVar1,s);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->Args,0);
  cmsys::SystemTools::GetProgramPath(&local_b0,pvVar2);
  cmAlphaNum::cmAlphaNum(&local_90,&local_b0);
  cmAlphaNum::cmAlphaNum(&local_e0,"/cmake");
  cmStrCat<>((string *)local_60,&local_90,&local_e0);
  std::__cxx11::string::~string((string *)&local_b0);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->Args,0);
  std::__cxx11::string::operator=((string *)pvVar2,(string *)local_60);
  pcVar1 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->(&this->CMakeInstance);
  cmake::SetArgs(pcVar1,&this->Args);
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

cmCursesMainForm::cmCursesMainForm(std::vector<std::string> args,
                                   int initWidth)
  : Args(std::move(args))
  , InitialWidth(initWidth)
{
  this->HelpMessage.emplace_back(
    "Welcome to ccmake, curses based user interface for CMake.");
  this->HelpMessage.emplace_back();
  this->HelpMessage.emplace_back(s_ConstHelpMessage);
  this->CMakeInstance =
    cm::make_unique<cmake>(cmake::RoleProject, cmState::Project);
  this->CMakeInstance->SetCMakeEditCommand(
    cmSystemTools::GetCMakeCursesCommand());

  // create the arguments for the cmake object
  std::string whereCMake =
    cmStrCat(cmSystemTools::GetProgramPath(this->Args[0]), "/cmake");
  this->Args[0] = whereCMake;
  this->CMakeInstance->SetArgs(this->Args);
}